

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerUndoCallback(void *pCtx,Pgno iPg)

{
  int iVar1;
  u32 local_2c;
  DbPage *pDStack_28;
  u32 iFrame;
  PgHdr *pPg;
  Pager *pPager;
  int rc;
  Pgno iPg_local;
  void *pCtx_local;
  
  pPager._0_4_ = 0;
  pPg = (PgHdr *)pCtx;
  pPager._4_4_ = iPg;
  _rc = pCtx;
  pDStack_28 = sqlite3PagerLookup((Pager *)pCtx,iPg);
  if (pDStack_28 != (DbPage *)0x0) {
    iVar1 = sqlite3PcachePageRefcount(pDStack_28);
    if (iVar1 == 1) {
      sqlite3PcacheDrop(pDStack_28);
    }
    else {
      local_2c = 0;
      pPager._0_4_ = sqlite3WalFindFrame((Wal *)pPg[4].pPage,pDStack_28->pgno,&local_2c);
      if ((int)pPager == 0) {
        pPager._0_4_ = readDbPage(pDStack_28,local_2c);
      }
      if ((int)pPager == 0) {
        (*(code *)pPg[3].pPager)(pDStack_28);
      }
      sqlite3PagerUnrefNotNull(pDStack_28);
    }
  }
  sqlite3BackupRestart((sqlite3_backup *)pPg[1].pPager);
  return (int)pPager;
}

Assistant:

static int pagerUndoCallback(void *pCtx, Pgno iPg){
  int rc = SQLITE_OK;
  Pager *pPager = (Pager *)pCtx;
  PgHdr *pPg;

  assert( pagerUseWal(pPager) );
  pPg = sqlite3PagerLookup(pPager, iPg);
  if( pPg ){
    if( sqlite3PcachePageRefcount(pPg)==1 ){
      sqlite3PcacheDrop(pPg);
    }else{
      u32 iFrame = 0;
      rc = sqlite3WalFindFrame(pPager->pWal, pPg->pgno, &iFrame);
      if( rc==SQLITE_OK ){
        rc = readDbPage(pPg, iFrame);
      }
      if( rc==SQLITE_OK ){
        pPager->xReiniter(pPg);
      }
      sqlite3PagerUnrefNotNull(pPg);
    }
  }

  /* Normally, if a transaction is rolled back, any backup processes are
  ** updated as data is copied out of the rollback journal and into the
  ** database. This is not generally possible with a WAL database, as
  ** rollback involves simply truncating the log file. Therefore, if one
  ** or more frames have already been written to the log (and therefore 
  ** also copied into the backup databases) as part of this transaction,
  ** the backups must be restarted.
  */
  sqlite3BackupRestart(pPager->pBackup);

  return rc;
}